

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<capnp::json::Value::Field::Reader> * __thiscall
kj::ArrayBuilder<capnp::json::Value::Field::Reader>::operator=
          (ArrayBuilder<capnp::json::Value::Field::Reader> *this,
          ArrayBuilder<capnp::json::Value::Field::Reader> *other)

{
  ArrayBuilder<capnp::json::Value::Field::Reader> *other_local;
  ArrayBuilder<capnp::json::Value::Field::Reader> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Reader *)0x0;
  other->pos = (RemoveConst<capnp::json::Value::Field::Reader> *)0x0;
  other->endPtr = (Reader *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }